

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng::load_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  pointer __ptr;
  FILE *__stream;
  size_type __new_size;
  size_t sVar1;
  uint uVar2;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    uVar2 = 0x4e;
  }
  else {
    __new_size = lodepng_filesize((FILE *)__stream);
    if ((long)__new_size < 0) {
      uVar2 = 0x4e;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,__new_size);
      if (__new_size == 0) {
        uVar2 = 0;
      }
      else {
        __ptr = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
        sVar1 = fread(__ptr,1,(long)(buffer->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)__ptr,
                      __stream);
        uVar2 = 0x4e;
        if (sVar1 == (long)(buffer->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(buffer->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start) {
          uVar2 = 0;
        }
      }
    }
    fclose(__stream);
  }
  return uVar2;
}

Assistant:

unsigned load_file(std::vector<unsigned char>& buffer, const std::string& filename) {
  unsigned error;
  FILE* file = fopen(filename.c_str(), "rb");
  if(!file) return 78;
  error = load_file_(buffer, file);
  fclose(file);
  return error;
}